

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

void * ply_grow_array(p_ply_conflict ply,void **pointer,long *nmemb,long size)

{
  long lVar1;
  long lVar2;
  long in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  p_ply_conflict in_RDI;
  long count;
  void *temp;
  void *local_30;
  void *local_8;
  
  lVar1 = *in_RDX;
  lVar2 = lVar1 + 1;
  if ((void *)*in_RSI == (void *)0x0) {
    local_30 = malloc(lVar2 * in_RCX);
  }
  else {
    local_30 = realloc((void *)*in_RSI,lVar2 * in_RCX);
  }
  if (local_30 == (void *)0x0) {
    ply_ferror(in_RDI,"Out of memory");
    local_8 = (void *)0x0;
  }
  else {
    *in_RSI = local_30;
    *in_RDX = lVar2;
    local_8 = (void *)((long)local_30 + lVar1 * in_RCX);
  }
  return local_8;
}

Assistant:

static void *ply_grow_array(p_ply ply, void **pointer,
        long *nmemb, long size) {
    void *temp = *pointer;
    long count = *nmemb + 1;
    if (!temp) temp = malloc(count*size);
    else temp = realloc(temp, count*size);
    if (!temp) {
        ply_ferror(ply, "Out of memory");
        return NULL;
    }
    *pointer = temp;
    *nmemb = count;
    return (char *) temp + (count-1) * size;
}